

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSOSerializer.cpp
# Opt level: O0

bool Diligent::PSOSerializer<(Diligent::SerializerMode)0>::SerializeCreateInfo
               (Serializer<(Diligent::SerializerMode)0> *Ser,
               ConstQual<TilePipelineStateCreateInfo> *CreateInfo,ConstQual<TPRSNames> *PRSNames,
               DynamicLinearAllocator *Allocator)

{
  bool bVar1;
  DynamicLinearAllocator *Allocator_local;
  ConstQual<TPRSNames> *PRSNames_local;
  ConstQual<TilePipelineStateCreateInfo> *CreateInfo_local;
  Serializer<(Diligent::SerializerMode)0> *Ser_local;
  
  bVar1 = SerializeCreateInfo(Ser,&CreateInfo->super_PipelineStateCreateInfo,PRSNames,Allocator);
  if (bVar1) {
    Ser_local._7_1_ =
         Serializer<(Diligent::SerializerMode)0>::operator()
                   (Ser,&(CreateInfo->TilePipeline).NumRenderTargets,
                    &(CreateInfo->TilePipeline).SampleCount,&(CreateInfo->TilePipeline).RTVFormats);
  }
  else {
    Ser_local._7_1_ = false;
  }
  return Ser_local._7_1_;
}

Assistant:

bool PSOSerializer<Mode>::SerializeCreateInfo(
    Serializer<Mode>&                       Ser,
    ConstQual<TilePipelineStateCreateInfo>& CreateInfo,
    ConstQual<TPRSNames>&                   PRSNames,
    DynamicLinearAllocator*                 Allocator)
{
    if (!SerializeCreateInfo(Ser, static_cast<ConstQual<PipelineStateCreateInfo>&>(CreateInfo), PRSNames, Allocator))
        return false;

    // Serialize TilePipelineDesc
    return Ser(CreateInfo.TilePipeline.NumRenderTargets,
               CreateInfo.TilePipeline.SampleCount,
               CreateInfo.TilePipeline.RTVFormats);

    ASSERT_SIZEOF64(TilePipelineStateCreateInfo, 128, "Did you add a new member to TilePipelineStateCreateInfo? Please add serialization here.");
}